

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void check_leaf_list_backlinks(lyd_node *node,int op)

{
  lys_node *plVar1;
  lys_node *leaf;
  bool bVar2;
  ly_set *set_00;
  uint local_48;
  int validity_changed;
  uint32_t j;
  uint32_t i;
  ly_set *data;
  ly_set *set;
  lyd_node_leaf_list *leaf_list;
  lyd_node *iter;
  lyd_node *next;
  int op_local;
  lyd_node *node_local;
  
  bVar2 = false;
  leaf_list = (lyd_node_leaf_list *)node;
  if (((op != 0) && (op != 1)) && (op != 2)) {
    __assert_fail("(op == 0) || (op == 1) || (op == 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x531,"void check_leaf_list_backlinks(struct lyd_node *, int)");
  }
  while (leaf_list != (lyd_node_leaf_list *)0x0) {
    if (((leaf_list->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
       (leaf_list->schema->child != (lys_node *)0x0)) {
      plVar1 = leaf_list->schema->child;
      for (validity_changed = 0; (uint)validity_changed < *(uint *)((long)&plVar1->name + 4);
          validity_changed = validity_changed + 1) {
        set_00 = lyd_find_instance((lyd_node *)leaf_list,
                                   *(lys_node **)(plVar1->dsc + (ulong)(uint)validity_changed * 8));
        if (set_00 == (ly_set *)0x0) {
          ly_log(node->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0x54b);
          return;
        }
        for (local_48 = 0; local_48 < set_00->number; local_48 = local_48 + 1) {
          leaf = (set_00->set).s[local_48];
          if ((((op != 0) && (*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF)) &&
              ((lyd_node_leaf_list *)((lyd_val *)&leaf->parent)->binary == leaf_list)) ||
             ((op != 1 && (((ulong)leaf->child & 0x100000000) != 0)))) {
            *(byte *)&leaf->dsc = *(byte *)&leaf->dsc | 8;
            bVar2 = true;
            if (*(LY_DATA_TYPE *)&leaf->child == LY_TYPE_LEAFREF) {
              lyp_parse_value((lys_type *)&((lys_node *)leaf->name)[1].ref,(char **)&leaf->nodetype,
                              (lyxml_elem *)0x0,(lyd_node_leaf_list *)leaf,(lyd_attr *)0x0,
                              (lys_module *)0x0,1,(uint)(*(byte *)((long)&leaf->dsc + 1) & 1),0);
            }
          }
        }
        ly_set_free(set_00);
      }
    }
    if ((leaf_list->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      iter = (leaf_list->value).instance;
    }
    else {
      iter = (lyd_node *)0x0;
    }
    if (iter == (lyd_node *)0x0) {
      if (leaf_list == (lyd_node_leaf_list *)node) break;
      iter = leaf_list->next;
    }
    while ((iter == (lyd_node *)0x0 &&
           (leaf_list = (lyd_node_leaf_list *)leaf_list->parent, leaf_list->parent != node->parent))
          ) {
      iter = leaf_list->next;
    }
    leaf_list = (lyd_node_leaf_list *)iter;
  }
  if ((bVar2) && (node->parent != (lyd_node *)0x0)) {
    node->parent->validity = node->parent->validity | 4;
  }
  return;
}

Assistant:

static void
check_leaf_list_backlinks(struct lyd_node *node, int op)
{
    struct lyd_node *next, *iter;
    struct lyd_node_leaf_list *leaf_list;
    struct ly_set *set, *data;
    uint32_t i, j;
    int validity_changed = 0;

    assert((op == 0) || (op == 1) || (op == 2));

    /* fix leafrefs */
    LY_TREE_DFS_BEGIN(node, next, iter) {
        /* the node is target of a leafref */
        if ((iter->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && iter->schema->child) {
            set = (struct ly_set *)iter->schema->child;
            for (i = 0; i < set->number; i++) {
                data = lyd_find_instance(iter, set->set.s[i]);
                if (data) {
                    for (j = 0; j < data->number; j++) {
                        leaf_list = (struct lyd_node_leaf_list *)data->set.d[j];
                        if (((op != 0) && (leaf_list->value_type == LY_TYPE_LEAFREF) && (leaf_list->value.leafref == iter))
                                || ((op != 1) && (leaf_list->value_flags & LY_VALUE_UNRES))) {
                            /* invalidate the leafref, a change concerning it happened */
                            leaf_list->validity |= LYD_VAL_LEAFREF;
                            validity_changed = 1;
                            if (leaf_list->value_type == LY_TYPE_LEAFREF) {
                                /* remove invalid link and put unresolved value back */
                                lyp_parse_value(&((struct lys_node_leaf *)leaf_list->schema)->type, &leaf_list->value_str,
                                                NULL, leaf_list, NULL, NULL, 1, leaf_list->dflt, 0);
                            }
                        }
                    }
                    ly_set_free(data);
                } else {
                    LOGINT(node->schema->module->ctx);
                    return;
                }
            }
        }
        LY_TREE_DFS_END(node, next, iter)
    }

    /* invalidate parent to make sure it will be checked in future validation */
    if (validity_changed && node->parent) {
        node->parent->validity |= LYD_VAL_MAND;
    }
}